

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_20661e::VersionPrinter::print(VersionPrinter *this)

{
  bool bVar1;
  raw_ostream *this_00;
  raw_ostream *prVar2;
  string CPU;
  string local_40;
  
  this_00 = llvm::outs();
  llvm::raw_ostream::operator<<(this_00,"LLVM (http://llvm.org/):\n  ");
  prVar2 = llvm::raw_ostream::operator<<(this_00,"LLVM");
  prVar2 = llvm::raw_ostream::operator<<(prVar2," version ");
  llvm::raw_ostream::operator<<(prVar2,"7.0.0svn");
  llvm::raw_ostream::operator<<(this_00,"\n  ");
  llvm::raw_ostream::operator<<(this_00,"Optimized build");
  llvm::raw_ostream::operator<<(this_00," with assertions");
  local_40._0_16_ = llvm::sys::getHostCPUName();
  llvm::StringRef::str_abi_cxx11_(&CPU,(StringRef *)&local_40);
  bVar1 = std::operator==(&CPU,"generic");
  if (bVar1) {
    std::__cxx11::string::assign((char *)&CPU);
  }
  prVar2 = llvm::raw_ostream::operator<<(this_00,".\n");
  prVar2 = llvm::raw_ostream::operator<<(prVar2,"  Default target: ");
  llvm::sys::getDefaultTargetTriple_abi_cxx11_();
  prVar2 = llvm::raw_ostream::operator<<(prVar2,&local_40);
  prVar2 = llvm::raw_ostream::operator<<(prVar2,'\n');
  prVar2 = llvm::raw_ostream::operator<<(prVar2,"  Host CPU: ");
  llvm::raw_ostream::operator<<(prVar2,&CPU);
  std::__cxx11::string::_M_dispose();
  llvm::raw_ostream::operator<<(this_00,'\n');
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void print() {
    raw_ostream &OS = outs();
#ifdef PACKAGE_VENDOR
    OS << PACKAGE_VENDOR << " ";
#else
    OS << "LLVM (http://llvm.org/):\n  ";
#endif
    OS << PACKAGE_NAME << " version " << PACKAGE_VERSION;
#ifdef LLVM_VERSION_INFO
    OS << " " << LLVM_VERSION_INFO;
#endif
    OS << "\n  ";
#ifndef __OPTIMIZE__
    OS << "DEBUG build";
#else
    OS << "Optimized build";
#endif
#ifndef NDEBUG
    OS << " with assertions";
#endif
#if LLVM_VERSION_PRINTER_SHOW_HOST_TARGET_INFO
    std::string CPU = sys::getHostCPUName();
    if (CPU == "generic")
      CPU = "(unknown)";
    OS << ".\n"
       << "  Default target: " << sys::getDefaultTargetTriple() << '\n'
       << "  Host CPU: " << CPU;
#endif
    OS << '\n';
  }